

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  input_option local_38;
  
  local_38.filename = (char *)0x0;
  local_38.print_header = false;
  local_38.headers_only = false;
  local_38._10_6_ = 0;
  local_38.max_filesize = 0x60000000;
  memleak_start();
  iVar1 = parse_options(argc,argv,&local_38);
  if (iVar1 == 0) {
    iVar1 = process_file(&local_38);
    fdb_shutdown();
  }
  memleak_end();
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    struct input_option opt;
    memset(&opt, 0 , sizeof(struct input_option));
    opt.max_filesize = MAX_FILE_SIZE;
    memleak_start();
    int ret = parse_options(argc, argv, &opt);

    if (ret) {
        memleak_end();
        return ret;
    }

    ret = process_file(&opt);

    fdb_shutdown();
    memleak_end();
    return ret;
}